

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall CLParam<bool>::PrintSimple(CLParam<bool> *this)

{
  ostream *poVar1;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 8));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RDI + 0x50) & 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintSimple()
    {
        std::cout << parameter_name << " " << value << std::endl ;
    }